

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int CompareMat(Mat *a,Mat *b,float epsilon)

{
  Mat *in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  Mat b32_1;
  Mat b32;
  Mat a32_1;
  Mat a32;
  Mat b1;
  Mat a1;
  Option *in_stack_00000618;
  undefined4 in_stack_00000620;
  int in_stack_00000624;
  Mat *in_stack_00000628;
  Mat *in_stack_00000630;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  float in_stack_fffffffffffffdbc;
  Mat *in_stack_fffffffffffffdc0;
  Mat *in_stack_fffffffffffffdc8;
  Mat local_210;
  Mat local_1a8;
  Mat local_140;
  Mat local_d8 [2];
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (*(int *)(in_RDI + 0x18) == 1) {
    if (in_RSI->elempack == 1) {
      if (*(long *)(in_RDI + 0x10) == 2) {
        ncnn::Mat::Mat(&local_140);
        ncnn::Option::Option
                  ((Option *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        ncnn::cast_float16_to_float32
                  (in_stack_00000630,in_stack_00000628,
                   (Option *)CONCAT44(in_stack_00000624,in_stack_00000620));
        local_4 = CompareMat(in_RSI,(Mat *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
        ncnn::Mat::~Mat((Mat *)0x117aea);
      }
      else if (*(long *)(in_RDI + 0x10) == 1) {
        ncnn::Mat::Mat(&local_1a8);
        ncnn::Option::Option
                  ((Option *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        ncnn::cast_int8_to_float32
                  (in_stack_00000630,in_stack_00000628,
                   (Option *)CONCAT44(in_stack_00000624,in_stack_00000620));
        local_4 = CompareMat(in_RSI,(Mat *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
        ncnn::Mat::~Mat((Mat *)0x117ba9);
      }
      else if (in_RSI->elemsize == 2) {
        ncnn::Mat::Mat(&local_210);
        ncnn::Option::Option
                  ((Option *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        ncnn::cast_float16_to_float32
                  (in_stack_00000630,in_stack_00000628,
                   (Option *)CONCAT44(in_stack_00000624,in_stack_00000620));
        local_4 = CompareMat(in_RSI,(Mat *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
        ncnn::Mat::~Mat((Mat *)0x117c68);
      }
      else if (in_RSI->elemsize == 1) {
        ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffd88);
        ncnn::Option::Option
                  ((Option *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        ncnn::cast_int8_to_float32
                  (in_stack_00000630,in_stack_00000628,
                   (Option *)CONCAT44(in_stack_00000624,in_stack_00000620));
        local_4 = CompareMat(in_RSI,(Mat *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
        ncnn::Mat::~Mat((Mat *)0x117d21);
      }
      else {
        local_4 = Compare(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                          in_stack_fffffffffffffdbc);
      }
    }
    else {
      ncnn::Mat::Mat(local_d8);
      ncnn::Option::Option((Option *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      ncnn::convert_packing(in_stack_00000630,in_stack_00000628,in_stack_00000624,in_stack_00000618)
      ;
      local_4 = CompareMat(in_RSI,(Mat *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc);
      ncnn::Mat::~Mat((Mat *)0x117a2b);
    }
  }
  else {
    ncnn::Mat::Mat((Mat *)&local_d8[1].cstep);
    ncnn::Option::Option((Option *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
    ncnn::convert_packing(in_stack_00000630,in_stack_00000628,in_stack_00000624,in_stack_00000618);
    local_4 = CompareMat(in_RSI,(Mat *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
    ncnn::Mat::~Mat((Mat *)0x117968);
  }
  return local_4;
}

Assistant:

static int CompareMat(const ncnn::Mat& a, const ncnn::Mat& b, float epsilon = 0.001)
{
    if (a.elempack != 1)
    {
        ncnn::Mat a1;
        ncnn::convert_packing(a, a1, 1);
        return CompareMat(a1, b, epsilon);
    }

    if (b.elempack != 1)
    {
        ncnn::Mat b1;
        ncnn::convert_packing(b, b1, 1);
        return CompareMat(a, b1, epsilon);
    }

    if (a.elemsize == 2u)
    {
        ncnn::Mat a32;
        cast_float16_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }
    if (a.elemsize == 1u)
    {
        ncnn::Mat a32;
        cast_int8_to_float32(a, a32);
        return CompareMat(a32, b, epsilon);
    }

    if (b.elemsize == 2u)
    {
        ncnn::Mat b32;
        cast_float16_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }
    if (b.elemsize == 1u)
    {
        ncnn::Mat b32;
        cast_int8_to_float32(b, b32);
        return CompareMat(a, b32, epsilon);
    }

    return Compare(a, b, epsilon);
}